

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O1

void scsp_write_ram(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  scsp_state *scsp;
  
  uVar1 = *(uint *)((long)info + 0x1460);
  if (offset <= uVar1 && uVar1 - offset != 0) {
    __n = (ulong)(uVar1 - offset);
    if (length + offset <= uVar1) {
      __n = (ulong)length;
    }
    memcpy((void *)((ulong)offset + *(long *)((long)info + 0x1458)),data,__n);
    return;
  }
  return;
}

Assistant:

static void scsp_write_ram(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	scsp_state *scsp = (scsp_state *)info;
	
	if (offset >= scsp->SCSPRAM_LENGTH)
		return;
	if (offset + length > scsp->SCSPRAM_LENGTH)
		length = scsp->SCSPRAM_LENGTH - offset;
	
	memcpy(scsp->SCSPRAM + offset, data, length);
	
	return;
}